

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCode __thiscall
PDFDocumentHandler::WritePDFStreamInputToContentContext
          (PDFDocumentHandler *this,PageContentContext *inContentContext,
          PDFStreamInput *inContentSource,StringToStringMap *inMappedResourcesNames)

{
  Trace *pTVar1;
  PDFStream *this_00;
  IByteWriter *inTargetStream;
  PDFStream *contentStream;
  EStatusCode status;
  StringToStringMap *inMappedResourcesNames_local;
  PDFStreamInput *inContentSource_local;
  PageContentContext *inContentContext_local;
  PDFDocumentHandler *this_local;
  
  contentStream._4_4_ = PageContentContext::StartAStreamIfRequired(inContentContext);
  if (contentStream._4_4_ == eSuccess) {
    this_00 = PageContentContext::GetCurrentPageContentStream(inContentContext);
    if (this_00 == (PDFStream *)0x0) {
      pTVar1 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar1,
                        "PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to get current page content stream"
                       );
      contentStream._4_4_ = eFailure;
    }
    else {
      inTargetStream = PDFStream::GetWriteStream(this_00);
      contentStream._4_4_ =
           WritePDFStreamInputToStream(this,inTargetStream,inContentSource,inMappedResourcesNames);
      if (contentStream._4_4_ == eSuccess) {
        contentStream._4_4_ = PageContentContext::FinalizeCurrentStream(inContentContext);
      }
      else {
        pTVar1 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar1,
                          "PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to write content stream from page input to target page"
                         );
      }
    }
  }
  else {
    pTVar1 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar1,
                      "PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to start a stream in content context"
                     );
  }
  return contentStream._4_4_;
}

Assistant:

EStatusCode PDFDocumentHandler::WritePDFStreamInputToContentContext(PageContentContext* inContentContext,PDFStreamInput* inContentSource,const StringToStringMap& inMappedResourcesNames)
{
	EStatusCode status = PDFHummus::eSuccess;
	
	do
	{
		status = inContentContext->StartAStreamIfRequired();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to start a stream in content context");
			break;
		}

		PDFStream* contentStream = inContentContext->GetCurrentPageContentStream();
		if(!contentStream)
		{
			TRACE_LOG("PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to get current page content stream");
			status = PDFHummus::eFailure;
			break;
		}

		status = WritePDFStreamInputToStream(contentStream->GetWriteStream(),inContentSource,inMappedResourcesNames);
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("PDFDocumentHandler::WritePDFStreamInputToContentContext, failed to write content stream from page input to target page");
			break;
		}

		status = inContentContext->FinalizeCurrentStream(); // i want to begin a new stream after this, to maintain some sort of consistency [if important] with the embedded pages

	}while(false);

	return status;
}